

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O1

char * spvOpcodeString(uint32_t opcode)

{
  undefined1 *puVar1;
  difference_type __d;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  puVar1 = (anonymous_namespace)::kOpcodeTableEntries;
  uVar4 = 0x2ea;
  do {
    uVar2 = uVar4 >> 1;
    uVar3 = uVar2;
    if (*(uint *)((long)puVar1 + (uVar2 * 0xf + 1) * 8) < opcode) {
      uVar3 = ~uVar2 + uVar4;
      puVar1 = (undefined1 *)((long)puVar1 + (uVar2 * 0xf + 0xf) * 8);
    }
    uVar4 = uVar3;
  } while (0 < (long)uVar3);
  if (((spv_operand_table_t *)puVar1 != &kOperandTable) &&
     (*(uint32_t *)&((spv_operand_table_t *)puVar1)->types == opcode)) {
    return *(char **)puVar1;
  }
  __assert_fail("0 && \"Unreachable!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opcode.cpp"
                ,0xcb,"const char *spvOpcodeString(const uint32_t)");
}

Assistant:

const char* spvOpcodeString(const uint32_t opcode) {
  const auto beg = kOpcodeTableEntries;
  const auto end = kOpcodeTableEntries + ARRAY_SIZE(kOpcodeTableEntries);
  spv_opcode_desc_t needle = {"",    static_cast<spv::Op>(opcode),
                              0,     nullptr,
                              0,     {},
                              false, false,
                              0,     nullptr,
                              ~0u,   ~0u};
  auto comp = [](const spv_opcode_desc_t& lhs, const spv_opcode_desc_t& rhs) {
    return lhs.opcode < rhs.opcode;
  };
  auto it = std::lower_bound(beg, end, needle, comp);
  if (it != end && it->opcode == spv::Op(opcode)) {
    return it->name;
  }

  assert(0 && "Unreachable!");
  return "unknown";
}